

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O3

Variant anon_unknown.dwarf_62f9fb::make_variant(char *str)

{
  size_t sVar1;
  cali_variant_t cVar2;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    cVar2 = cali_make_variant(CALI_TYPE_STRING,str,sVar1 + 1);
    return (Variant)cVar2;
  }
  cVar2 = cali_make_variant(CALI_TYPE_STRING,"unknown",8);
  return (Variant)cVar2;
}

Assistant:

Variant make_variant(char* str)
{
    Variant var;

    if (nullptr == str) {
        var = Variant(CALI_TYPE_STRING, "unknown", 8);
    } else {
        var = Variant(CALI_TYPE_STRING, str, strlen(str) + 1);
    }

    return var;
}